

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collectives.hpp
# Opt level: O0

void diy::mpi::Collectives<std::vector<int,_std::allocator<int>_>,_std::plus<int>_>::reduce
               (communicator *comm,vector<int,_std::allocator<int>_> *in,int root,plus<int> *param_4
               )

{
  undefined4 in_EDX;
  void *in_RSI;
  datatype *in_RDI;
  int unaff_retaddr;
  void *in_stack_00000008;
  communicator *in_stack_00000010;
  int in_stack_00000020;
  operation op;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffe8;
  
  detail::mpi_op<std::plus<int>_>::get();
  address<std::vector<int,std::allocator<int>>>((vector<int,_std::allocator<int>_> *)0x110be5);
  count<std::vector<int,std::allocator<int>>>((vector<int,_std::allocator<int>_> *)0x110bf4);
  datatype_of<std::vector<int,std::allocator<int>>>
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  address<std::vector<int,std::allocator<int>>>((vector<int,_std::allocator<int>_> *)0x110c11);
  detail::reduce(in_stack_00000010,in_stack_00000008,unaff_retaddr,in_RDI,in_RSI,
                 (operation *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),in_stack_00000020);
  return;
}

Assistant:

static void reduce(const communicator& comm, const T& in, int root, const Op&)
    {
      auto op = detail::mpi_op<Op>::get();
      detail::reduce(comm, address(in), count(in), datatype_of(in), address(in), op, root);
    }